

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-attack.c
# Opt level: O1

_Bool effect_handler_LAVA_POOL(effect_handler_context_t *context)

{
  wchar_t wVar1;
  int iVar2;
  int iVar3;
  wchar_t wVar4;
  _Bool _Var5;
  wchar_t wVar6;
  loc_conflict grid1;
  wchar_t wVar7;
  int iVar8;
  loc grid;
  bool bVar9;
  
  wVar1 = context->radius;
  iVar2 = (player->grid).y;
  if (iVar2 - wVar1 <= iVar2 + wVar1) {
    iVar3 = (player->grid).x;
    grid1.y = iVar2;
    grid1.x = iVar3;
    wVar4 = iVar2 - wVar1;
    do {
      iVar8 = wVar1 * 2 + 1;
      wVar7 = iVar3 - wVar1;
      if (iVar3 - wVar1 <= iVar3 + wVar1) {
        do {
          grid.y = wVar4;
          grid.x = wVar7;
          wVar6 = distance(grid1,(loc_conflict)grid);
          if ((((wVar6 <= wVar1) && (_Var5 = square_in_bounds_fully(cave,grid), _Var5)) &&
              (_Var5 = square_ispermanent(cave,grid), !_Var5)) &&
             (_Var5 = square_isvault(cave,grid), !_Var5)) {
            square_set_feat(cave,grid,FEAT_LAVA);
          }
          iVar8 = iVar8 + -1;
          wVar7 = wVar7 + L'\x01';
        } while (iVar8 != 0);
      }
      bVar9 = wVar4 != iVar2 + wVar1;
      wVar4 = wVar4 + L'\x01';
    } while (bVar9);
  }
  return true;
}

Assistant:

bool effect_handler_LAVA_POOL(effect_handler_context_t *context)
{
	int r = context->radius;
	struct loc grid, pgrid = player->grid;

	/* Everything in range */
	for (grid.y = pgrid.y - r; grid.y <= pgrid.y + r; grid.y++) {
		for (grid.x = pgrid.x - r; grid.x <= pgrid.x + r; grid.x++) {
			int dist = distance(pgrid, grid);

			/* Skip distant grids */
			if (dist > r) continue;

			/* Skip grids that are out of bounds */
			if (!square_in_bounds_fully(cave, grid)) continue;

			/* Skip grids that are permanent */
			if (square_ispermanent(cave, grid)) continue;

			/* Skip grids in vaults */
			if (square_isvault(cave, grid)) continue;

			/* Lava now */
			square_set_feat(cave, grid, FEAT_LAVA);
		}
	}
	return true;
}